

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O2

int64_t lookup_gid(void *private_data,char *gname,int64_t gid)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *__ptr;
  size_t bufsize;
  size_t __buflen;
  group *result;
  undefined8 *local_e0;
  group grent;
  char _buffer [128];
  
  if ((gname != (char *)0x0) && (*gname != '\0')) {
    uVar2 = hash(gname);
    uVar5 = (ulong)(uint)((int)((ulong)(long)(int)uVar2 % 0x7f) << 4);
    puVar1 = (undefined8 *)((long)private_data + uVar5);
    pcVar4 = *(char **)((long)private_data + uVar5);
    if ((pcVar4 != (char *)0x0) &&
       ((*(uint *)(puVar1 + 1) == uVar2 && (iVar3 = strcmp(gname,pcVar4), iVar3 == 0)))) {
      return (ulong)*(uint *)((long)puVar1 + 0xc);
    }
    free(pcVar4);
    pcVar4 = strdup(gname);
    *puVar1 = pcVar4;
    *(uint *)(puVar1 + 1) = uVar2;
    pcVar4 = _buffer;
    __buflen = 0x80;
    __ptr = (char *)0x0;
    local_e0 = puVar1;
    do {
      result = &grent;
      iVar3 = getgrnam_r(gname,(group *)&grent,pcVar4,__buflen,(group **)&result);
      if (iVar3 != 0x22) goto LAB_00146acb;
      __buflen = __buflen * 2;
      free(__ptr);
      pcVar4 = (char *)malloc(__buflen);
      __ptr = pcVar4;
    } while (pcVar4 != (char *)0x0);
    __ptr = (char *)0x0;
LAB_00146acb:
    if (result != (group *)0x0) {
      gid = (int64_t)result->gr_gid;
    }
    free(__ptr);
    *(int *)((long)local_e0 + 0xc) = (int)gid;
  }
  return gid;
}

Assistant:

static int64_t
lookup_gid(void *private_data, const char *gname, int64_t gid)
{
	int h;
	struct bucket *b;
	struct bucket *gcache = (struct bucket *)private_data;

	/* If no gname, just use the gid provided. */
	if (gname == NULL || *gname == '\0')
		return (gid);

	/* Try to find gname in the cache. */
	h = hash(gname);
	b = &gcache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(gname, b->name) == 0)
		return ((gid_t)b->id);

	/* Free the cache slot for a new entry. */
	free(b->name);
	b->name = strdup(gname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_GRP_H
#  if HAVE_GETGRNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct group	grent, *result;
		int r;

		for (;;) {
			result = &grent; /* Old getgrnam_r ignores last arg. */
			r = getgrnam_r(gname, &grent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			gid = result->gr_gid;
		free(allocated);
	}
#  else /* HAVE_GETGRNAM_R */
	{
		struct group *result;

		result = getgrnam(gname);
		if (result != NULL)
			gid = result->gr_gid;
	}
#  endif /* HAVE_GETGRNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a gname->gid lookup for Windows. */
#else
	#error No way to perform gid lookups on this platform
#endif
	b->id = (gid_t)gid;

	return (gid);
}